

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatest.cpp
# Opt level: O3

bool TestPowerAmplifier(int curLine,AmpIO *Board,BasePort *Port,ofstream *logFile,uint qlaNum)

{
  char cVar1;
  uint index;
  byte bVar2;
  byte bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  ostream *poVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  uint index_00;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  unsigned_long cur [4];
  char buf [100];
  ulong local_128;
  ulong local_100;
  ulong local_c8;
  ulong local_b8 [4];
  char local_98 [104];
  
  iVar7 = 0;
  AmpIO::WriteWatchdogPeriod(Board,0);
  uVar4 = BoardIO::GetFirmwareVersion((BoardIO *)Board);
  cVar1 = (char)logFile;
  std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar1);
  std::ostream::put(cVar1);
  poVar6 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"=== Power Amplifier Test ===",0x1c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  Amp1394Console::Print(curLine,9,"Temperature sensors - ");
  Amp1394Console::Refresh();
  AmpIO::WritePowerEnable(Board,true);
  uVar9 = (uint)(qlaNum == 2) * 4;
  if (uVar4 < 8) {
    AmpIO::WriteAmpEnable(Board,0xf,0xf);
  }
  else {
    do {
      AmpIO::WriteAmpEnableAxis(Board,iVar7 + uVar9,true);
      iVar7 = iVar7 + 1;
    } while (iVar7 != 4);
  }
  iVar7 = 0;
  do {
    AmpIO::SetMotorCurrent(Board,iVar7 + uVar9,0x8000);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 4);
  (*Port->_vptr_BasePort[0x21])(Port);
  Amp1394_Sleep(1.0);
  (*Port->_vptr_BasePort[0x1d])(Port);
  if (uVar4 < 8) {
    uVar5 = AmpIO::GetStatus(Board);
    if ((~uVar5 & 0xc0f0f) != 0) {
      sprintf(local_98,"Failed to enable power (%08lx) - is motor power connected?",(ulong)uVar5);
LAB_00108161:
      Amp1394Console::Print(curLine,9,local_98);
      curLine = curLine + 1;
    }
  }
  else {
    iVar7 = 0;
    do {
      bVar14 = AmpIO::GetAmpEnable(Board,iVar7 + uVar9);
      if (!bVar14) {
        builtin_strncpy(local_98,"Failed to enable power - is motor power connected?",0x33);
        goto LAB_00108161;
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != 4);
  }
  Amp1394Console::Print(curLine,9,"Temperature sensors - ");
  index = (uint)(qlaNum == 2) * 2;
  bVar2 = AmpIO::GetAmpTemperature(Board,index);
  index_00 = (uint)(qlaNum == 2) * 2 + 1;
  bVar3 = AmpIO::GetAmpTemperature(Board,index_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)logFile,"   Motor temperatures: ",0x17);
  *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
       *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)logFile);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," degC (expected range is 20-40) ",0x20)
  ;
  bVar14 = (byte)(bVar2 + 0xae) < 0xd6;
  bVar15 = (byte)(bVar3 + 0xae) < 0xd6;
  pcVar10 = "- PASS";
  if (bVar15 || bVar14) {
    pcVar10 = "- FAIL";
  }
  pcVar12 = "PASS (%d, %d degC)";
  if (bVar15 || bVar14) {
    pcVar12 = "FAIL (%d, %d degC)";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,pcVar10,6);
  std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  sprintf(local_98,pcVar12,(ulong)(bVar2 >> 1),(ulong)(bVar3 >> 1));
  Amp1394Console::Print(curLine,0x1f,local_98);
  Amp1394Console::Print(curLine + 1,9,"DAC:");
  Amp1394Console::Print(curLine + 2,9,"ADC:");
  Amp1394Console::Print(curLine + 4,9,"Temp:");
  Amp1394Console::Refresh();
  local_128 = 0x8000;
  bVar14 = true;
  local_100 = (ulong)(bVar2 >> 1);
  local_c8 = (ulong)(bVar3 >> 1);
  while( true ) {
    sprintf(local_98,"%04lx   %04lx   %04lx   %04lx",local_128,local_128,local_128,local_128);
    Amp1394Console::Print(curLine + 1,0xf,local_98);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)logFile,"   Commanded current: ",0x16);
    *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
         *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)logFile);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", Measured currents: ",0x15);
    iVar7 = 0xf;
    lVar8 = 0;
    do {
      bVar17 = local_128 == 0;
      uVar5 = AmpIO::GetMotorCurrent(Board,uVar9 | (uint)lVar8);
      uVar13 = (ulong)uVar5;
      local_b8[lVar8] = uVar13;
      *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
           *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::ostream::_M_insert<unsigned_long>((ulong)logFile);
      bVar16 = uVar13 <= (local_128 | 0x100);
      bVar15 = local_128 - 0x100 <= uVar13;
      pcVar10 = "* ";
      if ((bVar15 || bVar17) && bVar16) {
        pcVar10 = "  ";
      }
      pcVar12 = "FAIL";
      if ((bVar15 || bVar17) && bVar16) {
        pcVar12 = "PASS";
      }
      bVar14 = (bool)(bVar14 & ((bVar15 || bVar17) && bVar16));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,pcVar10,2);
      Amp1394Console::Print(curLine + 3,iVar7,pcVar12);
      lVar8 = lVar8 + 1;
      iVar7 = iVar7 + 7;
    } while (lVar8 != 4);
    std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    sprintf(local_98,"%04lx   %04lx   %04lx   %04lx",local_b8[0],local_b8[1],local_b8[2],local_b8[3]
           );
    Amp1394Console::Print(curLine + 2,0xf,local_98);
    bVar2 = AmpIO::GetAmpTemperature(Board,index);
    bVar2 = bVar2 >> 1;
    bVar3 = AmpIO::GetAmpTemperature(Board,index_00);
    bVar3 = bVar3 >> 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)logFile,"   Motor temperatures: ",0x17);
    *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
         *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)logFile);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," degC (expected to be increasing)",0x21);
    pcVar10 = "PASS";
    pcVar12 = "PASS";
    if (bVar3 < (ushort)local_c8) {
      pcVar12 = "FAIL";
    }
    pcVar11 = " - PASS";
    if (bVar3 < (ushort)local_c8) {
      pcVar11 = " - fail";
    }
    if (bVar2 < (ushort)local_100) {
      pcVar11 = " - fail";
      pcVar10 = "FAIL";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,pcVar11,7);
    std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    sprintf(local_98,"%4d (%s)    %4d (%s)",(ulong)bVar2,pcVar10,(ulong)bVar3,pcVar12);
    Amp1394Console::Print(curLine + 4,0xf,local_98);
    Amp1394Console::Refresh();
    local_128 = ((ulong)(local_128 < 0x8001) << 9 | 0x10000) - local_128;
    iVar7 = 0;
    if (0x8600 < local_128) break;
    do {
      AmpIO::SetMotorCurrent(Board,iVar7 + uVar9,(uint32_t)local_128);
      iVar7 = iVar7 + 1;
    } while (iVar7 != 4);
    (*Port->_vptr_BasePort[0x21])(Port);
    Amp1394_Sleep(1.0);
    (*Port->_vptr_BasePort[0x1d])(Port);
    local_100 = (ulong)bVar2;
    local_c8 = (ulong)bVar3;
  }
  do {
    AmpIO::SetMotorCurrent(Board,uVar9 + iVar7,0x8000);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 4);
  (*Port->_vptr_BasePort[0x21])();
  if (uVar4 < 8) {
    AmpIO::WriteAmpEnable(Board,0xf,0);
  }
  else {
    iVar7 = 0;
    do {
      AmpIO::WriteAmpEnableAxis(Board,uVar9 + iVar7,false);
      iVar7 = iVar7 + 1;
    } while (iVar7 != 4);
  }
  AmpIO::WritePowerEnable(Board,false);
  AmpIO::WriteWatchdogPeriod(Board,0xffff);
  pcVar10 = "   Overall result: FAIL";
  if (bVar14 != false) {
    pcVar10 = "   Overall result: PASS";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,pcVar10,0x17);
  std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  return bVar14;
}

Assistant:

bool TestPowerAmplifier(int curLine, AmpIO &Board, BasePort *Port, std::ofstream &logFile, unsigned int qlaNum)
{
    char buf[100];
    unsigned long status;
    unsigned long dac;
    unsigned int i;
    bool pass = true;

    // Disable watchdog
    Board.WriteWatchdogPeriod(0x0000);

    uint32_t fver = Board.GetFirmwareVersion();

    logFile << std::endl << "=== Power Amplifier Test ===" << std::endl;
    Amp1394Console::Print(curLine, 9, "Temperature sensors - ");
    Amp1394Console::Refresh();

    Board.WritePowerEnable(true);

    unsigned int motorStart = (qlaNum == 2) ? 4 : 0;

    // Enabling individual amplifiers
    if (fver < 8) {
        Board.WriteAmpEnable(0x0f, 0x0f);
    }
    else {
        for (i = 0; i < 4; i++)
            Board.WriteAmpEnableAxis(motorStart+i, true);
    }
    dac = 0x8000;
    for (i = 0; i < 4; i++)
        Board.SetMotorCurrent(motorStart+i, dac);
    Port->WriteAllBoards();
    Amp1394_Sleep(1.0);  // wait for power to stabilize
    Port->ReadAllBoards();
    if (fver < 8) {
        status = Board.GetStatus();
        if ((status&0x000c0f0f) != 0x000c0f0f) {
            sprintf(buf,"Failed to enable power (%08lx) - is motor power connected?", status);
            Amp1394Console::Print(curLine++, 9, buf);
        }
    }
    else {
        for (i = 0; i < 4; i++) {
            bool motorEn = Board.GetAmpEnable(motorStart+i);
            if (!motorEn) {
                sprintf(buf,"Failed to enable power - is motor power connected?");
                Amp1394Console::Print(curLine++, 9, buf);
                break;
            }
        }
    }
    Amp1394Console::Print(curLine, 9, "Temperature sensors - ");
    // Read temperature in Celsius
    unsigned int tempStart = (qlaNum == 2) ? 2 : 0;
    unsigned short temp1 = Board.GetAmpTemperature(tempStart)/2;
    unsigned short temp2 = Board.GetAmpTemperature(tempStart+1)/2;
    logFile << "   Motor temperatures: " << std::dec << temp1 << ", " << temp2 << " degC (expected range is 20-40) ";
    if ((temp1 < 20) || (temp1 > 40) || (temp2 < 20) || (temp2 > 40)) {
        logFile << "- FAIL" << std::endl;
        sprintf(buf, "FAIL (%d, %d degC)", temp1, temp2);
    }
    else {
        logFile << "- PASS" << std::endl;
        sprintf(buf, "PASS (%d, %d degC)", temp1, temp2);
    }
    Amp1394Console::Print(curLine++, 31, buf);

    Amp1394Console::Print(curLine, 9, "DAC:");
    Amp1394Console::Print(curLine+1, 9, "ADC:");
    Amp1394Console::Print(curLine+3, 9, "Temp:");
    Amp1394Console::Refresh();

    // Increment of 0x0200 is about 100 mA; 0x9000 is approx. 780 mA.
    unsigned long cur[4];
    while (1) {
        sprintf(buf, "%04lx   %04lx   %04lx   %04lx", dac, dac, dac, dac);
        Amp1394Console::Print(curLine, 15, buf);
        logFile << "   Commanded current: " << std::hex << dac << ", Measured currents: ";
        for (i = 0; i < 4; i++) {
            cur[i] = Board.GetMotorCurrent(motorStart+i);
            logFile << std::hex << cur[i];
            if ((cur[i] > (dac + 0x0100))
                || ((dac > 0x0100)
                    && (cur[i] < (dac - 0x0100))
                    )
                ) {
                logFile << "* ";
                Amp1394Console::Print(curLine+2, 15+7*i, "FAIL");
                pass = false;
            }
            else {
                logFile << "  ";
                Amp1394Console::Print(curLine+2, 15+7*i, "PASS");
            }
        }
        logFile << std::endl;
        sprintf(buf, "%04lx   %04lx   %04lx   %04lx", cur[0], cur[1], cur[2], cur[3]);
        Amp1394Console::Print(curLine+1, 15, buf);

        unsigned short newTemp1 = Board.GetAmpTemperature(tempStart)/2;
        unsigned short newTemp2 = Board.GetAmpTemperature(tempStart+1)/2;
        logFile << "   Motor temperatures: " << std::dec  << newTemp1 << ", " << newTemp2 << " degC (expected to be increasing)";
        if ((newTemp1 >= temp1) && (newTemp2 >= temp2))
            logFile << " - PASS" << std::endl;
        else
            logFile << " - fail" << std::endl;
        sprintf(buf, "%4d (%s)    %4d (%s)", newTemp1, ((newTemp1 >= temp1) ? "PASS" : "FAIL"),
                newTemp2, ((newTemp2 >= temp2) ? "PASS" : "FAIL"));
        Amp1394Console::Print(curLine+3, 15, buf);
        temp1 = newTemp1;
        temp2 = newTemp2;
        Amp1394Console::Refresh();

        if (dac > 0x8000) dac = 0x8000 - (dac - 0x8000);
        else dac = 0x8000 + (0x8000 - dac) + 0x0200;

        if (dac > 0x8600) break;

        for (i = 0; i < 4; i++)
            Board.SetMotorCurrent(motorStart+i, dac);
        Port->WriteAllBoards();
        Amp1394_Sleep(1.0);
        Port->ReadAllBoards();
    }

    for (i = 0; i < 4; i++)
        Board.SetMotorCurrent(motorStart+i, 0x8000);
    Port->WriteAllBoards();
    if (fver < 8) {
        Board.WriteAmpEnable(0x0f, 0);
    }
    else {
        for (i = 0; i < 4; i++)
            Board.WriteAmpEnableAxis(motorStart+i, false);
    }
    Board.WritePowerEnable(false);

    // Reenable watchdog
    Board.WriteWatchdogPeriod(0xFFFF);
    if (pass)
        logFile << "   Overall result: PASS" << std::endl;
    else
        logFile << "   Overall result: FAIL" << std::endl;
    return pass;
}